

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_pain_type(parser *p)

{
  uint uVar1;
  void *pvVar2;
  void *v;
  monster_pain *mp;
  monster_pain *h;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  v = mem_zalloc(0x48);
  *(void **)((long)v + 0x40) = pvVar2;
  uVar1 = parser_getuint(p,"index");
  *(uint *)((long)v + 0x38) = uVar1;
  parser_setpriv(p,v);
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_pain_type(struct parser *p) {
	struct monster_pain *h = parser_priv(p);
	struct monster_pain *mp = mem_zalloc(sizeof *mp);
	mp->next = h;
	mp->pain_idx = parser_getuint(p, "index");
	parser_setpriv(p, mp);
	return PARSE_ERROR_NONE;
}